

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O2

void test_qpixl_frqi_compressedFRQICircuit<double>(void)

{
  undefined8 *puVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> *a_00;
  vector<double,_std::allocator<double>_> *a_01;
  long lVar3;
  vector<double,_std::allocator<double>_> *a_02;
  long lVar4;
  long lVar5;
  long lVar6;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  undefined1 auStack_148 [16];
  SquareMatrix<double> circC_check;
  SquareMatrix<double> circA_check;
  QCircuit<double,_qclab::QObject<double>_> circC;
  SquareMatrix<double> circB_check;
  vector<double,_std::allocator<double>_> c;
  vector<double,_std::allocator<double>_> b;
  vector<double,_std::allocator<double>_> a;
  QCircuit<double,_qclab::QObject<double>_> circB;
  QCircuit<double,_qclab::QObject<double>_> circA;
  
  circC.super_QObject<double>._vptr_QObject = (_func_int **)0x3fe0000000000000;
  circC.super_QAdjustable.fixed_ = false;
  circC._9_3_ = 0;
  circC.nbQubits_ = 0x3ff00000;
  __l._M_len = 2;
  __l._M_array = (iterator)&circC;
  std::vector<double,_std::allocator<double>_>::vector(&a,__l,(allocator_type *)&circA);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&circA,(frqi *)&a,a_00,0.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            (&circA_check,0.620544580563746,-0.339005049421045,0.620544580563746,-0.339005049421045,
             0.339005049421045,0.620544580563746,0.339005049421045,0.620544580563746,
             0.38205142437009,-0.595009839529386,-0.38205142437009,0.595009839529386,
             0.595009839529386,0.38205142437009,-0.595009839529386,-0.38205142437009);
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix(&circC);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)&circC,&circA_check,2.220446049250313e-15);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&circC.super_QAdjustable);
  circC.offset_ = 0;
  circC._20_4_ = 0x3ff80000;
  circC.gates_.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  circC.super_QObject<double>._vptr_QObject = (_func_int **)0x3fe0000000000000;
  circC.super_QAdjustable.fixed_ = false;
  circC._9_3_ = 0;
  circC.nbQubits_ = 0x3ff00000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&circC;
  std::vector<double,_std::allocator<double>_>::vector(&b,__l_00,(allocator_type *)&circB);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&circB,(frqi *)&b,a_01,0.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&circB_check,8);
  *(undefined8 *)
   circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0x3fdc1528065b7d49;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0x3fceaee8744b05de;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0x3fd14a280fb5068e;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0x3fdaed548f090ce9;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20) = 0x3fa21bd54fc5f966;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28) = 0x3fdfeb7a9b2c6d87;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30) = 0xbfcaa226575371fe;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38) = 0x3fdd18f6ead1b449;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + circB_check.size_ * 8);
  *puVar1 = 0xbfceaee8744b05de;
  puVar1[1] = 0x3fdc1528065b7d49;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + circB_check.size_ * 8
           );
  *puVar1 = 0xbfdaed548f090ce9;
  puVar1[1] = 0x3fd14a280fb5068e;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + circB_check.size_ * 8
           );
  *puVar1 = 0xbfdfeb7a9b2c6d87;
  puVar1[1] = 0x3fa21bd54fc5f966;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + circB_check.size_ * 8
           );
  *puVar1 = 0xbfdd18f6ead1b449;
  puVar1[1] = 0xbfcaa226575371fe;
  lVar3 = circB_check.size_ * 0x18;
  lVar4 = circB_check.size_ * 0x28;
  lVar5 = circB_check.size_ * 0x30;
  lVar6 = circB_check.size_ * 0x38;
  lVar2 = circB_check.size_ * 0x10;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0x3fdc1528065b7d49;
  ((undefined8 *)
  ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fceaee8744b05de;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbfd14a280fb5068e;
  puVar1[1] = 0xbfdaed548f090ce9;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3fa21bd54fc5f966;
  puVar1[1] = 0x3fdfeb7a9b2c6d87;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3fcaa226575371fe;
  puVar1[1] = 0xbfdd18f6ead1b449;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3) = 0xbfceaee8744b05de;
  ((undefined8 *)
  ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3))[1] = 0x3fdc1528065b7d49;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar3);
  *puVar1 = 0x3fdaed548f090ce9;
  puVar1[1] = 0xbfd14a280fb5068e;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar3);
  *puVar1 = 0xbfdfeb7a9b2c6d87;
  puVar1[1] = 0x3fa21bd54fc5f966;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar3);
  *puVar1 = 0x3fdd18f6ead1b449;
  puVar1[1] = 0x3fcaa226575371fe;
  lVar2 = circB_check.size_ * 0x20;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0x3fdc1528065b7d49;
  ((undefined8 *)
  ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fceaee8744b05de;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3fd14a280fb5068e;
  puVar1[1] = 0x3fdaed548f090ce9;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbfa21bd54fc5f966;
  puVar1[1] = 0xbfdfeb7a9b2c6d87;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3fcaa226575371fe;
  puVar1[1] = 0xbfdd18f6ead1b449;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar4) = 0xbfceaee8744b05de;
  ((undefined8 *)
  ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar4))[1] = 0x3fdc1528065b7d49;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar4);
  *puVar1 = 0xbfdaed548f090ce9;
  puVar1[1] = 0x3fd14a280fb5068e;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar4);
  *puVar1 = 0x3fdfeb7a9b2c6d87;
  puVar1[1] = 0xbfa21bd54fc5f966;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar4);
  *puVar1 = 0x3fdd18f6ead1b449;
  puVar1[1] = 0x3fcaa226575371fe;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar5) = 0x3fdc1528065b7d49;
  ((undefined8 *)
  ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar5))[1] = 0x3fceaee8744b05de;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar5);
  *puVar1 = 0xbfd14a280fb5068e;
  puVar1[1] = 0xbfdaed548f090ce9;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar5);
  *puVar1 = 0xbfa21bd54fc5f966;
  puVar1[1] = 0xbfdfeb7a9b2c6d87;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar5);
  *puVar1 = 0xbfcaa226575371fe;
  puVar1[1] = 0x3fdd18f6ead1b449;
  *(undefined8 *)
   ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar6) = 0xbfceaee8744b05de;
  ((undefined8 *)
  ((long)circB_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar6))[1] = 0x3fdc1528065b7d49;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar6);
  *puVar1 = 0x3fdaed548f090ce9;
  puVar1[1] = 0xbfd14a280fb5068e;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar6);
  *puVar1 = 0x3fdfeb7a9b2c6d87;
  puVar1[1] = 0xbfa21bd54fc5f966;
  puVar1 = (undefined8 *)
           ((long)circB_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar6);
  *puVar1 = 0xbfdd18f6ead1b449;
  puVar1[1] = 0xbfcaa226575371fe;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix(&circC);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)&circC,&circB_check,2.220446049250313e-15);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&circC.super_QAdjustable);
  circC.gates_.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
  circC.gates_.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  circC.offset_ = 0;
  circC._20_4_ = 0x3ff80000;
  circC.gates_.
  super__Vector_base<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<double>,_std::default_delete<qclab::QObject<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  circC.super_QObject<double>._vptr_QObject = (_func_int **)0x3fe0000000000000;
  circC.super_QAdjustable.fixed_ = false;
  circC._9_3_ = 0;
  circC.nbQubits_ = 0x3ff00000;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&circC;
  std::vector<double,_std::allocator<double>_>::vector(&c,__l_01,(allocator_type *)&circC_check);
  qpixl::frqi::compressedFRQICircuit<std::vector<double,std::allocator<double>>>
            (&circC,(frqi *)&c,a_02,0.0);
  qclab::dense::SquareMatrix<double>::SquareMatrix(&circC_check,0x10);
  *(undefined8 *)
   circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
   super__Head_base<0UL,_double_*,_false>._M_head_impl = 0x3fd3db804ee76706;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 8) = 0x3fc5b2423c1c4dc9;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10) = 0x3fc87387d143d302;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18) = 0x3fd30a5213327623;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20) = 0x3f999c0ee9a9d7c5;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28) = 0x3fd6921bb0a148a9;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30) = 0xbfc2d528f1aa0e4a;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38) = 0x3fd493369c7cb061;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40) = 0xbfd220b8331eff46;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x48) = 0x3fcb157122376395;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50) = 0xbfd666a62b64bd1f;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x58) = 0x3fa98ba29f08d105;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60) = 0xbfd530895c70420c;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x68) = 0xbfbfbfd062f033e8;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70) = 0xbfcd949dd8d79cbf;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x78) = 0xbfd11fde4a9443fb;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + circC_check.size_ * 8);
  *puVar1 = 0xbfc5b2423c1c4dc9;
  puVar1[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + circC_check.size_ * 8
           );
  *puVar1 = 0xbfd30a5213327623;
  puVar1[1] = 0x3fc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + circC_check.size_ * 8
           );
  *puVar1 = 0xbfd6921bb0a148a9;
  puVar1[1] = 0x3f999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + circC_check.size_ * 8
           );
  *puVar1 = 0xbfd493369c7cb061;
  puVar1[1] = 0xbfc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + circC_check.size_ * 8
           );
  *puVar1 = 0xbfcb157122376395;
  puVar1[1] = 0xbfd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + circC_check.size_ * 8
           );
  *puVar1 = 0xbfa98ba29f08d105;
  puVar1[1] = 0xbfd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + circC_check.size_ * 8
           );
  *puVar1 = 0x3fbfbfd062f033e8;
  puVar1[1] = 0xbfd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + circC_check.size_ * 8
           );
  *puVar1 = 0x3fd11fde4a9443fb;
  puVar1[1] = 0xbfcd949dd8d79cbf;
  lVar2 = circC_check.size_ * 0x18;
  lVar4 = circC_check.size_ * 0x28;
  lVar3 = circC_check.size_ * 0x30;
  lVar5 = circC_check.size_ * 0x10;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar5) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar5))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar5);
  *puVar1 = 0xbfc87387d143d302;
  puVar1[1] = 0xbfd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar5);
  *puVar1 = 0x3f999c0ee9a9d7c5;
  puVar1[1] = 0x3fd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar5);
  *puVar1 = 0x3fc2d528f1aa0e4a;
  puVar1[1] = 0xbfd493369c7cb061;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar5);
  *puVar1 = 0xbfd220b8331eff46;
  puVar1[1] = 0x3fcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar5);
  *puVar1 = 0x3fd666a62b64bd1f;
  puVar1[1] = 0xbfa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar5);
  *puVar1 = 0xbfd530895c70420c;
  puVar1[1] = 0xbfbfbfd062f033e8;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar5);
  *puVar1 = 0x3fcd949dd8d79cbf;
  puVar1[1] = 0x3fd11fde4a9443fb;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0xbfc5b2423c1c4dc9;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3fd30a5213327623;
  puVar1[1] = 0xbfc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbfd6921bb0a148a9;
  puVar1[1] = 0x3f999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3fd493369c7cb061;
  puVar1[1] = 0x3fc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0xbfcb157122376395;
  puVar1[1] = 0xbfd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0x3fa98ba29f08d105;
  puVar1[1] = 0x3fd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0x3fbfbfd062f033e8;
  puVar1[1] = 0xbfd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0xbfd11fde4a9443fb;
  puVar1[1] = 0x3fcd949dd8d79cbf;
  lVar2 = circC_check.size_ * 0x20;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3fc87387d143d302;
  puVar1[1] = 0x3fd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbf999c0ee9a9d7c5;
  puVar1[1] = 0xbfd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3fc2d528f1aa0e4a;
  puVar1[1] = 0xbfd493369c7cb061;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0xbfd220b8331eff46;
  puVar1[1] = 0x3fcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0xbfd666a62b64bd1f;
  puVar1[1] = 0x3fa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0x3fd530895c70420c;
  puVar1[1] = 0x3fbfbfd062f033e8;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0x3fcd949dd8d79cbf;
  puVar1[1] = 0x3fd11fde4a9443fb;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar4) = 0xbfc5b2423c1c4dc9;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar4))[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar4);
  *puVar1 = 0xbfd30a5213327623;
  puVar1[1] = 0x3fc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar4);
  *puVar1 = 0x3fd6921bb0a148a9;
  puVar1[1] = 0xbf999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar4);
  *puVar1 = 0x3fd493369c7cb061;
  puVar1[1] = 0x3fc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar4);
  *puVar1 = 0xbfcb157122376395;
  puVar1[1] = 0xbfd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar4);
  *puVar1 = 0xbfa98ba29f08d105;
  puVar1[1] = 0xbfd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar4);
  *puVar1 = 0xbfbfbfd062f033e8;
  puVar1[1] = 0x3fd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar4);
  *puVar1 = 0xbfd11fde4a9443fb;
  puVar1[1] = 0x3fcd949dd8d79cbf;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar3);
  *puVar1 = 0xbfc87387d143d302;
  puVar1[1] = 0xbfd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar3);
  *puVar1 = 0xbf999c0ee9a9d7c5;
  puVar1[1] = 0xbfd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar3);
  *puVar1 = 0xbfc2d528f1aa0e4a;
  puVar1[1] = 0x3fd493369c7cb061;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar3);
  *puVar1 = 0xbfd220b8331eff46;
  puVar1[1] = 0x3fcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar3);
  *puVar1 = 0x3fd666a62b64bd1f;
  puVar1[1] = 0xbfa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar3);
  *puVar1 = 0x3fd530895c70420c;
  puVar1[1] = 0x3fbfbfd062f033e8;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar3);
  *puVar1 = 0xbfcd949dd8d79cbf;
  puVar1[1] = 0xbfd11fde4a9443fb;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + circC_check.size_ * 0x38);
  *puVar1 = 0xbfc5b2423c1c4dc9;
  puVar1[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 +
           circC_check.size_ * 0x38);
  *puVar1 = 0x3fd30a5213327623;
  puVar1[1] = 0xbfc87387d143d302;
  lVar2 = circC_check.size_ * 0x38;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3fd6921bb0a148a9;
  puVar1[1] = 0xbf999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbfd493369c7cb061;
  puVar1[1] = 0xbfc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0xbfcb157122376395;
  puVar1[1] = 0xbfd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0x3fa98ba29f08d105;
  puVar1[1] = 0x3fd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0xbfbfbfd062f033e8;
  puVar1[1] = 0x3fd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0x3fd11fde4a9443fb;
  puVar1[1] = 0xbfcd949dd8d79cbf;
  lVar2 = circC_check.size_ * 0x48;
  lVar4 = circC_check.size_ * 0x50;
  lVar3 = circC_check.size_ * 0x40;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar3);
  *puVar1 = 0x3fc87387d143d302;
  puVar1[1] = 0x3fd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar3);
  *puVar1 = 0x3f999c0ee9a9d7c5;
  puVar1[1] = 0x3fd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar3);
  *puVar1 = 0xbfc2d528f1aa0e4a;
  puVar1[1] = 0x3fd493369c7cb061;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar3);
  *puVar1 = 0x3fd220b8331eff46;
  puVar1[1] = 0xbfcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar3);
  *puVar1 = 0x3fd666a62b64bd1f;
  puVar1[1] = 0xbfa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar3);
  *puVar1 = 0x3fd530895c70420c;
  puVar1[1] = 0x3fbfbfd062f033e8;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar3);
  *puVar1 = 0x3fcd949dd8d79cbf;
  puVar1[1] = 0x3fd11fde4a9443fb;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0xbfc5b2423c1c4dc9;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbfd30a5213327623;
  puVar1[1] = 0x3fc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbfd6921bb0a148a9;
  puVar1[1] = 0x3f999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbfd493369c7cb061;
  puVar1[1] = 0xbfc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0x3fcb157122376395;
  puVar1[1] = 0x3fd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0x3fa98ba29f08d105;
  puVar1[1] = 0x3fd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0xbfbfbfd062f033e8;
  puVar1[1] = 0x3fd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0xbfd11fde4a9443fb;
  puVar1[1] = 0x3fcd949dd8d79cbf;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar4) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar4))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar4);
  *puVar1 = 0xbfc87387d143d302;
  puVar1[1] = 0xbfd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar4);
  *puVar1 = 0x3f999c0ee9a9d7c5;
  puVar1[1] = 0x3fd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar4);
  *puVar1 = 0x3fc2d528f1aa0e4a;
  puVar1[1] = 0xbfd493369c7cb061;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar4);
  *puVar1 = 0x3fd220b8331eff46;
  puVar1[1] = 0xbfcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar4);
  *puVar1 = 0xbfd666a62b64bd1f;
  puVar1[1] = 0x3fa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar4);
  *puVar1 = 0x3fd530895c70420c;
  puVar1[1] = 0x3fbfbfd062f033e8;
  lVar3 = circC_check.size_ * 0x58;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar4);
  *puVar1 = 0xbfcd949dd8d79cbf;
  puVar1[1] = 0xbfd11fde4a9443fb;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3) = 0xbfc5b2423c1c4dc9;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar3))[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar3);
  *puVar1 = 0x3fd30a5213327623;
  puVar1[1] = 0xbfc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar3);
  *puVar1 = 0xbfd6921bb0a148a9;
  puVar1[1] = 0x3f999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar3);
  *puVar1 = 0x3fd493369c7cb061;
  puVar1[1] = 0x3fc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar3);
  *puVar1 = 0x3fcb157122376395;
  puVar1[1] = 0x3fd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar3);
  *puVar1 = 0xbfa98ba29f08d105;
  puVar1[1] = 0xbfd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar3);
  *puVar1 = 0xbfbfbfd062f033e8;
  puVar1[1] = 0x3fd530895c70420c;
  lVar2 = circC_check.size_ * 0x60;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar3);
  *puVar1 = 0x3fd11fde4a9443fb;
  puVar1[1] = 0xbfcd949dd8d79cbf;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3fc87387d143d302;
  puVar1[1] = 0x3fd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbf999c0ee9a9d7c5;
  puVar1[1] = 0xbfd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3fc2d528f1aa0e4a;
  puVar1[1] = 0xbfd493369c7cb061;
  lVar2 = circC_check.size_ * 0x60;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0x3fd220b8331eff46;
  puVar1[1] = 0xbfcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0x3fd666a62b64bd1f;
  puVar1[1] = 0xbfa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0xbfd530895c70420c;
  puVar1[1] = 0xbfbfbfd062f033e8;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0xbfcd949dd8d79cbf;
  puVar1[1] = 0xbfd11fde4a9443fb;
  lVar2 = circC_check.size_ * 0x68;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0xbfc5b2423c1c4dc9;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbfd30a5213327623;
  puVar1[1] = 0x3fc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3fd6921bb0a148a9;
  puVar1[1] = 0xbf999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0x3fd493369c7cb061;
  puVar1[1] = 0x3fc2d528f1aa0e4a;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0x3fcb157122376395;
  puVar1[1] = 0x3fd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0x3fa98ba29f08d105;
  puVar1[1] = 0x3fd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0x3fbfbfd062f033e8;
  puVar1[1] = 0xbfd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0x3fd11fde4a9443fb;
  puVar1[1] = 0xbfcd949dd8d79cbf;
  lVar2 = circC_check.size_ * 0x70;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0x3fd3db804ee76706;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fc5b2423c1c4dc9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0xbfc87387d143d302;
  puVar1[1] = 0xbfd30a5213327623;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0xbf999c0ee9a9d7c5;
  puVar1[1] = 0xbfd6921bb0a148a9;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbfc2d528f1aa0e4a;
  puVar1[1] = 0x3fd493369c7cb061;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0x3fd220b8331eff46;
  puVar1[1] = 0xbfcb157122376395;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0xbfd666a62b64bd1f;
  puVar1[1] = 0x3fa98ba29f08d105;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0xbfd530895c70420c;
  puVar1[1] = 0xbfbfbfd062f033e8;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0x3fcd949dd8d79cbf;
  puVar1[1] = 0x3fd11fde4a9443fb;
  lVar2 = circC_check.size_ * 0x78;
  *(undefined8 *)
   ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
          super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2) = 0xbfc5b2423c1c4dc9;
  ((undefined8 *)
  ((long)circC_check.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar2))[1] = 0x3fd3db804ee76706;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10 + lVar2);
  *puVar1 = 0x3fd30a5213327623;
  puVar1[1] = 0xbfc87387d143d302;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20 + lVar2);
  *puVar1 = 0x3fd6921bb0a148a9;
  puVar1[1] = 0xbf999c0ee9a9d7c5;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30 + lVar2);
  *puVar1 = 0xbfd493369c7cb061;
  puVar1[1] = 0xbfc2d528f1aa0e4a;
  lVar2 = circC_check.size_ * 0x78;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40 + lVar2);
  *puVar1 = 0x3fcb157122376395;
  puVar1[1] = 0x3fd220b8331eff46;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x50 + lVar2);
  *puVar1 = 0xbfa98ba29f08d105;
  puVar1[1] = 0xbfd666a62b64bd1f;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x60 + lVar2);
  *puVar1 = 0x3fbfbfd062f033e8;
  puVar1[1] = 0xbfd530895c70420c;
  puVar1 = (undefined8 *)
           ((long)circC_check.data_._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x70 + lVar2);
  *puVar1 = 0xbfd11fde4a9443fb;
  puVar1[1] = 0x3fcd949dd8d79cbf;
  qclab::QCircuit<double,_qclab::QObject<double>_>::matrix
            ((QCircuit<double,_qclab::QObject<double>_> *)auStack_148);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
            ((SquareMatrix<double> *)auStack_148,&circC_check,2.220446049250313e-15);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)(auStack_148 + 8));
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&circC_check.data_);
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit(&circC);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&circB_check.data_);
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit(&circB);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&b.super__Vector_base<double,_std::allocator<double>_>);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&circA_check.data_);
  qclab::QCircuit<double,_qclab::QObject<double>_>::~QCircuit(&circA);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&a.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void test_qpixl_frqi_compressedFRQICircuit() {
  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 0.5 , 1 } ;

  auto circA = qpixl::frqi::compressedFRQICircuit( a ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circA_check(    
  0.620544580563746, -0.339005049421045,  0.620544580563746, -0.339005049421045,
  0.339005049421045,  0.620544580563746,  0.339005049421045,  0.620544580563746,
  0.382051424370090, -0.595009839529386, -0.382051424370090,  0.595009839529386,
  0.595009839529386,  0.382051424370090, -0.595009839529386, -0.382051424370090
  ) ;

  test_qpixl_frqi_check_matrix( circA.matrix() , circA_check  , 10*eps );
  
  
  std::vector< R > b = { 0.5 , 1 , 1.5 , 2 };

  auto circB = qpixl::frqi::compressedFRQICircuit( b ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circB_check( 8 ) ;

  circB_check( 0, 0 ) =  0.438791280945186 ;
  circB_check( 1, 0 ) =  0.239712769302101 ;
  circB_check( 2, 0 ) =  0.270151152934070 ;
  circB_check( 3, 0 ) =  0.420735492403948 ;
  circB_check( 4, 0 ) =  0.035368600833851 ;
  circB_check( 5, 0 ) =  0.498747493302027 ;
  circB_check( 6, 0 ) = -0.208073418273571 ;
  circB_check( 7, 0 ) =  0.454648713412841 ;

  circB_check( 0, 1 ) = -0.239712769302101 ;
  circB_check( 1, 1 ) =  0.438791280945186 ;
  circB_check( 2, 1 ) = -0.420735492403948 ;
  circB_check( 3, 1 ) =  0.270151152934070 ;
  circB_check( 4, 1 ) = -0.498747493302027 ;
  circB_check( 5, 1 ) =  0.035368600833851 ;
  circB_check( 6, 1 ) = -0.454648713412841 ;
  circB_check( 7, 1 ) = -0.208073418273571 ;

  circB_check( 0, 2 ) =  0.438791280945186 ;
  circB_check( 1, 2 ) =  0.239712769302101 ;
  circB_check( 2, 2 ) = -0.270151152934070 ;
  circB_check( 3, 2 ) = -0.420735492403948 ;
  circB_check( 4, 2 ) =  0.035368600833851 ;
  circB_check( 5, 2 ) =  0.498747493302027 ;
  circB_check( 6, 2 ) =  0.208073418273571 ;
  circB_check( 7, 2 ) = -0.454648713412841 ;

  circB_check( 0, 3 ) = -0.239712769302101 ;
  circB_check( 1, 3 ) =  0.438791280945186 ;
  circB_check( 2, 3 ) =  0.420735492403948 ;
  circB_check( 3, 3 ) = -0.270151152934070 ;
  circB_check( 4, 3 ) = -0.498747493302027 ;
  circB_check( 5, 3 ) =  0.035368600833851 ;
  circB_check( 6, 3 ) =  0.454648713412841 ;
  circB_check( 7, 3 ) =  0.208073418273571 ;

  circB_check( 0, 4 ) =  0.438791280945186 ;
  circB_check( 1, 4 ) =  0.239712769302101 ;
  circB_check( 2, 4 ) =  0.270151152934070 ;
  circB_check( 3, 4 ) =  0.420735492403948 ;
  circB_check( 4, 4 ) = -0.035368600833851 ;
  circB_check( 5, 4 ) = -0.498747493302027 ;
  circB_check( 6, 4 ) =  0.208073418273571 ;
  circB_check( 7, 4 ) = -0.454648713412841 ;

  circB_check( 0, 5 ) = -0.239712769302101 ;
  circB_check( 1, 5 ) =  0.438791280945186 ;
  circB_check( 2, 5 ) = -0.420735492403948 ;
  circB_check( 3, 5 ) =  0.270151152934070 ;
  circB_check( 4, 5 ) =  0.498747493302027 ;
  circB_check( 5, 5 ) = -0.035368600833851 ;
  circB_check( 6, 5 ) =  0.454648713412841 ;
  circB_check( 7, 5 ) =  0.208073418273571 ;

  circB_check( 0, 6 ) =  0.438791280945186 ;
  circB_check( 1, 6 ) =  0.239712769302101 ;
  circB_check( 2, 6 ) = -0.270151152934070 ;
  circB_check( 3, 6 ) = -0.420735492403948 ;
  circB_check( 4, 6 ) = -0.035368600833851 ;
  circB_check( 5, 6 ) = -0.498747493302027 ;
  circB_check( 6, 6 ) = -0.208073418273571 ;
  circB_check( 7, 6 ) =  0.454648713412841 ;

  circB_check( 0, 7 ) = -0.239712769302101 ;
  circB_check( 1, 7 ) =  0.438791280945186 ;
  circB_check( 2, 7 ) =  0.420735492403948 ;
  circB_check( 3, 7 ) = -0.270151152934070 ;
  circB_check( 4, 7 ) =  0.498747493302027 ;
  circB_check( 5, 7 ) = -0.035368600833851 ;
  circB_check( 6, 7 ) = -0.454648713412841 ;
  circB_check( 7, 7 ) = -0.208073418273571 ;


  test_qpixl_frqi_check_matrix( circB.matrix() , circB_check  , 10*eps );



  std::vector< R > c = { 0.5 , 1 , 1.5 , 2 , 2.5 , 3 , 3.5 , 4 };

  auto circC = qpixl::frqi::compressedFRQICircuit( c ) ;  

  // matrix
  qclab::dense::SquareMatrix< R > circC_check( 16 ) ;

  circC_check(  0, 0 ) =    0.310272290281873 ;
  circC_check(  1, 0 ) =    0.169502524710522 ;
  circC_check(  2, 0 ) =    0.191025712185045 ;
  circC_check(  3, 0 ) =    0.297504919764693 ;
  circC_check(  4, 0 ) =    0.025009377490697 ;
  circC_check(  5, 0 ) =    0.352667734613656 ;
  circC_check(  6, 0 ) =   -0.147130125045907 ;
  circC_check(  7, 0 ) =    0.321485188311959 ;
  circC_check(  8, 0 ) =   -0.283247041628773 ;
  circC_check(  9, 0 ) =    0.211591855723580 ;
  circC_check( 10, 0 ) =   -0.350015203834987 ;
  circC_check( 11, 0 ) =    0.049893457330116 ;
  circC_check( 12, 0 ) =   -0.331087436935406 ;
  circC_check( 13, 0 ) =   -0.124020599512917 ;
  circC_check( 14, 0 ) =   -0.231097918395994 ;
  circC_check( 15, 0 ) =   -0.267570088225568 ;

  circC_check(  0, 1 ) =   -0.169502524710522 ;
  circC_check(  1, 1 ) =    0.310272290281873 ;
  circC_check(  2, 1 ) =   -0.297504919764693 ;
  circC_check(  3, 1 ) =    0.191025712185045 ;
  circC_check(  4, 1 ) =   -0.352667734613656 ;
  circC_check(  5, 1 ) =    0.025009377490697 ;
  circC_check(  6, 1 ) =   -0.321485188311959 ;
  circC_check(  7, 1 ) =   -0.147130125045907 ;
  circC_check(  8, 1 ) =   -0.211591855723580 ;
  circC_check(  9, 1 ) =   -0.283247041628773 ;
  circC_check( 10, 1 ) =   -0.049893457330116 ;
  circC_check( 11, 1 ) =   -0.350015203834987 ;
  circC_check( 12, 1 ) =    0.124020599512917 ;
  circC_check( 13, 1 ) =   -0.331087436935406 ;
  circC_check( 14, 1 ) =    0.267570088225568 ;
  circC_check( 15, 1 ) =   -0.231097918395994 ;

  circC_check(  0, 2 ) =    0.310272290281873 ;
  circC_check(  1, 2 ) =    0.169502524710522 ;
  circC_check(  2, 2 ) =   -0.191025712185045 ;
  circC_check(  3, 2 ) =   -0.297504919764693 ;
  circC_check(  4, 2 ) =    0.025009377490697 ;
  circC_check(  5, 2 ) =    0.352667734613656 ;
  circC_check(  6, 2 ) =    0.147130125045907 ;
  circC_check(  7, 2 ) =   -0.321485188311959 ;
  circC_check(  8, 2 ) =   -0.283247041628773 ;
  circC_check(  9, 2 ) =    0.211591855723580 ;
  circC_check( 10, 2 ) =    0.350015203834987 ;
  circC_check( 11, 2 ) =   -0.049893457330116 ;
  circC_check( 12, 2 ) =   -0.331087436935406 ;
  circC_check( 13, 2 ) =   -0.124020599512917 ;
  circC_check( 14, 2 ) =    0.231097918395994 ;
  circC_check( 15, 2 ) =    0.267570088225568 ;

  circC_check(  0, 3 ) =   -0.169502524710522 ;
  circC_check(  1, 3 ) =    0.310272290281873 ;
  circC_check(  2, 3 ) =    0.297504919764693 ;
  circC_check(  3, 3 ) =   -0.191025712185045 ;
  circC_check(  4, 3 ) =   -0.352667734613656 ;
  circC_check(  5, 3 ) =    0.025009377490697 ;
  circC_check(  6, 3 ) =    0.321485188311959 ;
  circC_check(  7, 3 ) =    0.147130125045907 ;
  circC_check(  8, 3 ) =   -0.211591855723580 ;
  circC_check(  9, 3 ) =   -0.283247041628773 ;
  circC_check( 10, 3 ) =    0.049893457330116 ;
  circC_check( 11, 3 ) =    0.350015203834987 ;
  circC_check( 12, 3 ) =    0.124020599512917 ;
  circC_check( 13, 3 ) =   -0.331087436935406 ;
  circC_check( 14, 3 ) =   -0.267570088225568 ;
  circC_check( 15, 3 ) =    0.231097918395994 ;

  circC_check(  0, 4 ) =    0.310272290281873 ;
  circC_check(  1, 4 ) =    0.169502524710522 ;
  circC_check(  2, 4 ) =    0.191025712185045 ;
  circC_check(  3, 4 ) =    0.297504919764693 ;
  circC_check(  4, 4 ) =   -0.025009377490697 ;
  circC_check(  5, 4 ) =   -0.352667734613656 ;
  circC_check(  6, 4 ) =    0.147130125045907 ;
  circC_check(  7, 4 ) =   -0.321485188311959 ;
  circC_check(  8, 4 ) =   -0.283247041628773 ;
  circC_check(  9, 4 ) =    0.211591855723580 ;
  circC_check( 10, 4 ) =   -0.350015203834987 ;
  circC_check( 11, 4 ) =    0.049893457330116 ;
  circC_check( 12, 4 ) =    0.331087436935406 ;
  circC_check( 13, 4 ) =    0.124020599512917 ;
  circC_check( 14, 4 ) =    0.231097918395994 ;
  circC_check( 15, 4 ) =    0.267570088225568 ;

  circC_check(  0, 5 ) =   -0.169502524710522 ;
  circC_check(  1, 5 ) =    0.310272290281873 ;
  circC_check(  2, 5 ) =   -0.297504919764693 ;
  circC_check(  3, 5 ) =    0.191025712185045 ;
  circC_check(  4, 5 ) =    0.352667734613656 ;
  circC_check(  5, 5 ) =   -0.025009377490697 ;
  circC_check(  6, 5 ) =    0.321485188311959 ;
  circC_check(  7, 5 ) =    0.147130125045907 ;
  circC_check(  8, 5 ) =   -0.211591855723580 ;
  circC_check(  9, 5 ) =   -0.283247041628773 ;
  circC_check( 10, 5 ) =   -0.049893457330116 ;
  circC_check( 11, 5 ) =   -0.350015203834987 ;
  circC_check( 12, 5 ) =   -0.124020599512917 ;
  circC_check( 13, 5 ) =    0.331087436935406 ;
  circC_check( 14, 5 ) =   -0.267570088225568 ;
  circC_check( 15, 5 ) =    0.231097918395994 ;

  circC_check(  0, 6 ) =    0.310272290281873 ;
  circC_check(  1, 6 ) =    0.169502524710522 ;
  circC_check(  2, 6 ) =   -0.191025712185045 ;
  circC_check(  3, 6 ) =   -0.297504919764693 ;
  circC_check(  4, 6 ) =   -0.025009377490697 ;
  circC_check(  5, 6 ) =   -0.352667734613656 ;
  circC_check(  6, 6 ) =   -0.147130125045907 ;
  circC_check(  7, 6 ) =    0.321485188311959 ;
  circC_check(  8, 6 ) =   -0.283247041628773 ;
  circC_check(  9, 6 ) =    0.211591855723580 ;
  circC_check( 10, 6 ) =    0.350015203834987 ;
  circC_check( 11, 6 ) =   -0.049893457330116 ;
  circC_check( 12, 6 ) =    0.331087436935406 ;
  circC_check( 13, 6 ) =    0.124020599512917 ;
  circC_check( 14, 6 ) =   -0.231097918395994 ;
  circC_check( 15, 6 ) =   -0.267570088225568 ;

  circC_check(  0, 7 ) =   -0.169502524710522 ;
  circC_check(  1, 7 ) =    0.310272290281873 ;
  circC_check(  2, 7 ) =    0.297504919764693 ;
  circC_check(  3, 7 ) =   -0.191025712185045 ;
  circC_check(  4, 7 ) =    0.352667734613656 ;
  circC_check(  5, 7 ) =   -0.025009377490697 ;
  circC_check(  6, 7 ) =   -0.321485188311959 ;
  circC_check(  7, 7 ) =   -0.147130125045907 ;
  circC_check(  8, 7 ) =   -0.211591855723580 ;
  circC_check(  9, 7 ) =   -0.283247041628773 ;
  circC_check( 10, 7 ) =    0.049893457330116 ;
  circC_check( 11, 7 ) =    0.350015203834987 ;
  circC_check( 12, 7 ) =   -0.124020599512917 ;
  circC_check( 13, 7 ) =    0.331087436935406 ;
  circC_check( 14, 7 ) =    0.267570088225568 ;
  circC_check( 15, 7 ) =   -0.231097918395994 ;

  circC_check(  0, 8 ) =    0.310272290281873 ;
  circC_check(  1, 8 ) =    0.169502524710522 ;
  circC_check(  2, 8 ) =    0.191025712185045 ;
  circC_check(  3, 8 ) =    0.297504919764693 ;
  circC_check(  4, 8 ) =    0.025009377490697 ;
  circC_check(  5, 8 ) =    0.352667734613656 ;
  circC_check(  6, 8 ) =   -0.147130125045907 ;
  circC_check(  7, 8 ) =    0.321485188311959 ;
  circC_check(  8, 8 ) =    0.283247041628773 ;
  circC_check(  9, 8 ) =   -0.211591855723580 ;
  circC_check( 10, 8 ) =    0.350015203834987 ;
  circC_check( 11, 8 ) =   -0.049893457330116 ;
  circC_check( 12, 8 ) =    0.331087436935406 ;
  circC_check( 13, 8 ) =    0.124020599512917 ;
  circC_check( 14, 8 ) =    0.231097918395994 ;
  circC_check( 15, 8 ) =    0.267570088225568 ;

  circC_check(  0, 9 ) =   -0.169502524710522 ;
  circC_check(  1, 9 ) =    0.310272290281873 ;
  circC_check(  2, 9 ) =   -0.297504919764693 ;
  circC_check(  3, 9 ) =    0.191025712185045 ;
  circC_check(  4, 9 ) =   -0.352667734613656 ;
  circC_check(  5, 9 ) =    0.025009377490697 ;
  circC_check(  6, 9 ) =   -0.321485188311959 ;
  circC_check(  7, 9 ) =   -0.147130125045907 ;
  circC_check(  8, 9 ) =    0.211591855723580 ;
  circC_check(  9, 9 ) =    0.283247041628773 ;
  circC_check( 10, 9 ) =    0.049893457330116 ;
  circC_check( 11, 9 ) =    0.350015203834987 ;
  circC_check( 12, 9 ) =   -0.124020599512917 ;
  circC_check( 13, 9 ) =    0.331087436935406 ;
  circC_check( 14, 9 ) =   -0.267570088225568 ;
  circC_check( 15, 9 ) =    0.231097918395994 ;

  circC_check(  0, 10 ) =    0.310272290281873 ;
  circC_check(  1, 10 ) =    0.169502524710522 ;
  circC_check(  2, 10 ) =   -0.191025712185045 ;
  circC_check(  3, 10 ) =   -0.297504919764693 ;
  circC_check(  4, 10 ) =    0.025009377490697 ;
  circC_check(  5, 10 ) =    0.352667734613656 ;
  circC_check(  6, 10 ) =    0.147130125045907 ;
  circC_check(  7, 10 ) =   -0.321485188311959 ;
  circC_check(  8, 10 ) =    0.283247041628773 ;
  circC_check(  9, 10 ) =   -0.211591855723580 ;
  circC_check( 10, 10 ) =   -0.350015203834987 ;
  circC_check( 11, 10 ) =    0.049893457330116 ;
  circC_check( 12, 10 ) =    0.331087436935406 ;
  circC_check( 13, 10 ) =    0.124020599512917 ;
  circC_check( 14, 10 ) =   -0.231097918395994 ;
  circC_check( 15, 10 ) =   -0.267570088225568 ;

  circC_check(  0, 11 ) =   -0.169502524710522 ;
  circC_check(  1, 11 ) =    0.310272290281873 ;
  circC_check(  2, 11 ) =    0.297504919764693 ;
  circC_check(  3, 11 ) =   -0.191025712185045 ;
  circC_check(  4, 11 ) =   -0.352667734613656 ;
  circC_check(  5, 11 ) =    0.025009377490697 ;
  circC_check(  6, 11 ) =    0.321485188311959 ;
  circC_check(  7, 11 ) =    0.147130125045907 ;
  circC_check(  8, 11 ) =    0.211591855723580 ;
  circC_check(  9, 11 ) =    0.283247041628773 ;
  circC_check( 10, 11 ) =   -0.049893457330116 ;
  circC_check( 11, 11 ) =   -0.350015203834987 ;
  circC_check( 12, 11 ) =   -0.124020599512917 ;
  circC_check( 13, 11 ) =    0.331087436935406 ;
  circC_check( 14, 11 ) =    0.267570088225568 ;
  circC_check( 15, 11 ) =   -0.231097918395994 ;

  circC_check(  0, 12 ) =    0.310272290281873 ;
  circC_check(  1, 12 ) =    0.169502524710522 ;
  circC_check(  2, 12 ) =    0.191025712185045 ;
  circC_check(  3, 12 ) =    0.297504919764693 ;
  circC_check(  4, 12 ) =   -0.025009377490697 ;
  circC_check(  5, 12 ) =   -0.352667734613656 ;
  circC_check(  6, 12 ) =    0.147130125045907 ;
  circC_check(  7, 12 ) =   -0.321485188311959 ;
  circC_check(  8, 12 ) =    0.283247041628773 ;
  circC_check(  9, 12 ) =   -0.211591855723580 ;
  circC_check( 10, 12 ) =    0.350015203834987 ;
  circC_check( 11, 12 ) =   -0.049893457330116 ;
  circC_check( 12, 12 ) =   -0.331087436935406 ;
  circC_check( 13, 12 ) =   -0.124020599512917 ;
  circC_check( 14, 12 ) =   -0.231097918395994 ;
  circC_check( 15, 12 ) =   -0.267570088225568 ;

  circC_check(  0, 13 ) =   -0.169502524710522 ;
  circC_check(  1, 13 ) =    0.310272290281873 ;
  circC_check(  2, 13 ) =   -0.297504919764693 ;
  circC_check(  3, 13 ) =    0.191025712185045 ;
  circC_check(  4, 13 ) =    0.352667734613656 ;
  circC_check(  5, 13 ) =   -0.025009377490697 ;
  circC_check(  6, 13 ) =    0.321485188311959 ;
  circC_check(  7, 13 ) =    0.147130125045907 ;
  circC_check(  8, 13 ) =    0.211591855723580 ;
  circC_check(  9, 13 ) =    0.283247041628773 ;
  circC_check( 10, 13 ) =    0.049893457330116 ;
  circC_check( 11, 13 ) =    0.350015203834987 ;
  circC_check( 12, 13 ) =    0.124020599512917 ;
  circC_check( 13, 13 ) =   -0.331087436935406 ;
  circC_check( 14, 13 ) =    0.267570088225568 ;
  circC_check( 15, 13 ) =   -0.231097918395994 ;

  circC_check(  0, 14 ) =    0.310272290281873 ;
  circC_check(  1, 14 ) =    0.169502524710522 ;
  circC_check(  2, 14 ) =   -0.191025712185045 ;
  circC_check(  3, 14 ) =   -0.297504919764693 ;
  circC_check(  4, 14 ) =   -0.025009377490697 ;
  circC_check(  5, 14 ) =   -0.352667734613656 ;
  circC_check(  6, 14 ) =   -0.147130125045907 ;
  circC_check(  7, 14 ) =    0.321485188311959 ;
  circC_check(  8, 14 ) =    0.283247041628773 ;
  circC_check(  9, 14 ) =   -0.211591855723580 ;
  circC_check( 10, 14 ) =   -0.350015203834987 ;
  circC_check( 11, 14 ) =    0.049893457330116 ;
  circC_check( 12, 14 ) =   -0.331087436935406 ;
  circC_check( 13, 14 ) =   -0.124020599512917 ;
  circC_check( 14, 14 ) =    0.231097918395994 ;
  circC_check( 15, 14 ) =    0.267570088225568 ;

  circC_check(  0, 15 ) =   -0.169502524710522 ;
  circC_check(  1, 15 ) =    0.310272290281873 ;
  circC_check(  2, 15 ) =    0.297504919764693 ;
  circC_check(  3, 15 ) =   -0.191025712185045 ;
  circC_check(  4, 15 ) =    0.352667734613656 ;
  circC_check(  5, 15 ) =   -0.025009377490697 ;
  circC_check(  6, 15 ) =   -0.321485188311959 ;
  circC_check(  7, 15 ) =   -0.147130125045907 ;
  circC_check(  8, 15 ) =    0.211591855723580 ;
  circC_check(  9, 15 ) =    0.283247041628773 ;
  circC_check( 10, 15 ) =   -0.049893457330116 ;
  circC_check( 11, 15 ) =   -0.350015203834987 ;
  circC_check( 12, 15 ) =    0.124020599512917 ;
  circC_check( 13, 15 ) =   -0.331087436935406 ;
  circC_check( 14, 15 ) =   -0.267570088225568 ;
  circC_check( 15, 15 ) =    0.231097918395994 ;

  test_qpixl_frqi_check_matrix( circC.matrix() , circC_check  , 10*eps );
}